

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O2

void __thiscall
FIX41::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  FieldBase *pFVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  string *__lhs;
  
  pFVar2 = FIX::FieldMap::getFieldRef((FieldMap *)&message->field_0x70,0x23);
  __lhs = &pFVar2->m_string;
  bVar1 = std::operator==(__lhs,"0");
  if (bVar1) {
    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[4];
  }
  else {
    bVar1 = std::operator==(__lhs,"1");
    if (bVar1) {
      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[5];
    }
    else {
      bVar1 = std::operator==(__lhs,"2");
      if (bVar1) {
        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[6];
      }
      else {
        bVar1 = std::operator==(__lhs,"3");
        if (bVar1) {
          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[7];
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[8];
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[9];
            }
            else {
              bVar1 = std::operator==(__lhs,"6");
              if (bVar1) {
                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[10];
              }
              else {
                bVar1 = std::operator==(__lhs,"7");
                if (bVar1) {
                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xb];
                }
                else {
                  bVar1 = std::operator==(__lhs,"8");
                  if (bVar1) {
                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xc];
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"9");
                    if (bVar1) {
                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xd];
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"A");
                      if (bVar1) {
                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xe];
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"B");
                        if (bVar1) {
                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xf];
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"C");
                          if (bVar1) {
                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x10];
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"D");
                            if (bVar1) {
                              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x11];
                            }
                            else {
                              bVar1 = std::operator==(__lhs,"E");
                              if (bVar1) {
                                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x12];
                              }
                              else {
                                bVar1 = std::operator==(__lhs,"F");
                                if (bVar1) {
                                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x13];
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,"G");
                                  if (bVar1) {
                                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x14];
                                  }
                                  else {
                                    bVar1 = std::operator==(__lhs,"H");
                                    if (bVar1) {
                                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x15];
                                    }
                                    else {
                                      bVar1 = std::operator==(__lhs,"J");
                                      if (bVar1) {
                                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x16];
                                      }
                                      else {
                                        bVar1 = std::operator==(__lhs,"K");
                                        if (bVar1) {
                                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x17];
                                        }
                                        else {
                                          bVar1 = std::operator==(__lhs,"L");
                                          if (bVar1) {
                                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x18]
                                            ;
                                          }
                                          else {
                                            bVar1 = std::operator==(__lhs,"M");
                                            if (bVar1) {
                                              UNRECOVERED_JUMPTABLE =
                                                   this->_vptr_MessageCracker[0x19];
                                            }
                                            else {
                                              bVar1 = std::operator==(__lhs,"N");
                                              if (bVar1) {
                                                UNRECOVERED_JUMPTABLE =
                                                     this->_vptr_MessageCracker[0x1a];
                                              }
                                              else {
                                                bVar1 = std::operator==(__lhs,"P");
                                                if (bVar1) {
                                                  UNRECOVERED_JUMPTABLE =
                                                       this->_vptr_MessageCracker[0x1b];
                                                }
                                                else {
                                                  bVar1 = std::operator==(__lhs,"Q");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x1c];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"R");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x1d];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"S");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x1e];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"T");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x1f];
                                                        }
                                                        else {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[2];
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,message,sessionID);
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string & msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    
    if( msgTypeValue == "0" )
      return onMessage( (const Heartbeat&)message, sessionID );
    
    if( msgTypeValue == "1" )
      return onMessage( (const TestRequest&)message, sessionID );
    
    if( msgTypeValue == "2" )
      return onMessage( (const ResendRequest&)message, sessionID );
    
    if( msgTypeValue == "3" )
      return onMessage( (const Reject&)message, sessionID );
    
    if( msgTypeValue == "4" )
      return onMessage( (const SequenceReset&)message, sessionID );
    
    if( msgTypeValue == "5" )
      return onMessage( (const Logout&)message, sessionID );
    
    if( msgTypeValue == "6" )
      return onMessage( (const IOI&)message, sessionID );
    
    if( msgTypeValue == "7" )
      return onMessage( (const Advertisement&)message, sessionID );
    
    if( msgTypeValue == "8" )
      return onMessage( (const ExecutionReport&)message, sessionID );
    
    if( msgTypeValue == "9" )
      return onMessage( (const OrderCancelReject&)message, sessionID );
    
    if( msgTypeValue == "A" )
      return onMessage( (const Logon&)message, sessionID );
    
    if( msgTypeValue == "B" )
      return onMessage( (const News&)message, sessionID );
    
    if( msgTypeValue == "C" )
      return onMessage( (const Email&)message, sessionID );
    
    if( msgTypeValue == "D" )
      return onMessage( (const NewOrderSingle&)message, sessionID );
    
    if( msgTypeValue == "E" )
      return onMessage( (const NewOrderList&)message, sessionID );
    
    if( msgTypeValue == "F" )
      return onMessage( (const OrderCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "G" )
      return onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    
    if( msgTypeValue == "H" )
      return onMessage( (const OrderStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "J" )
      return onMessage( (const Allocation&)message, sessionID );
    
    if( msgTypeValue == "K" )
      return onMessage( (const ListCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "L" )
      return onMessage( (const ListExecute&)message, sessionID );
    
    if( msgTypeValue == "M" )
      return onMessage( (const ListStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "N" )
      return onMessage( (const ListStatus&)message, sessionID );
    
    if( msgTypeValue == "P" )
      return onMessage( (const AllocationInstructionAck&)message, sessionID );
    
    if( msgTypeValue == "Q" )
      return onMessage( (const DontKnowTrade&)message, sessionID );
    
    if( msgTypeValue == "R" )
      return onMessage( (const QuoteRequest&)message, sessionID );
    
    if( msgTypeValue == "S" )
      return onMessage( (const Quote&)message, sessionID );
    
    if( msgTypeValue == "T" )
      return onMessage( (const SettlementInstructions&)message, sessionID );
    
    return onMessage( message, sessionID );
  }